

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O1

void convert_sinsn(iasctx *ctx,easm_sinsn *sinsn)

{
  int iVar1;
  int iVar2;
  litem *plVar3;
  litem **pplVar4;
  long lVar5;
  
  plVar3 = (litem *)calloc(0x20,1);
  plVar3->type = LITEM_NAME;
  plVar3->str = sinsn->str;
  iVar1 = ctx->atomsmax;
  if (iVar1 <= ctx->atomsnum) {
    iVar2 = 0x10;
    if (iVar1 != 0) {
      iVar2 = iVar1 * 2;
    }
    ctx->atomsmax = iVar2;
    pplVar4 = (litem **)realloc(ctx->atoms,(long)iVar2 << 3);
    ctx->atoms = pplVar4;
  }
  iVar1 = ctx->atomsnum;
  ctx->atomsnum = iVar1 + 1;
  ctx->atoms[iVar1] = plVar3;
  if (0 < sinsn->operandsnum) {
    lVar5 = 0;
    do {
      convert_operand(ctx,sinsn->operands[lVar5]);
      lVar5 = lVar5 + 1;
    } while (lVar5 < sinsn->operandsnum);
  }
  convert_mods(ctx,sinsn->mods);
  return;
}

Assistant:

void convert_sinsn(struct iasctx *ctx, struct easm_sinsn *sinsn) {
	int i;
	struct litem *li = calloc(sizeof *li, 1);
	li->type = LITEM_NAME;
	li->str = sinsn->str;
	ADDARRAY(ctx->atoms, li);
	for (i = 0; i < sinsn->operandsnum; i++) {
		convert_operand(ctx, sinsn->operands[i]);
	}
	convert_mods(ctx, sinsn->mods);
}